

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

void __thiscall QAccessibleMenuItem::actionNames(QAccessibleMenuItem *this)

{
  long in_RSI;
  
  actionNames((QStringList *)this,(QAccessibleMenuItem *)(in_RSI + -8));
  return;
}

Assistant:

QStringList QAccessibleMenuItem::actionNames() const
{
    QStringList actions;
    if (!m_action || m_action->isSeparator())
        return actions;

    if (m_action->menu()) {
        actions << showMenuAction();
    } else {
        actions << pressAction();
    }
    return actions;
}